

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void cptp_sighandler(int signum)

{
  long *in_FS_OFFSET;
  int signum_local;
  
  if (signum == 2) {
    log_log(0x40,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
            ,0x1a4,"Received SIGINT");
  }
  else if (signum == 0xf) {
    log_log(0x40,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
            ,0x1a7,"Received SIGTERM");
  }
  if (((signum == 0xf) || (signum == 2)) && (*(long *)(*in_FS_OFFSET + -8) != 0)) {
    *(undefined1 *)(*(long *)(*in_FS_OFFSET + -8) + 8) = 1;
    *(undefined4 *)(*(long *)(*in_FS_OFFSET + -8) + 0xc) = 1;
  }
  return;
}

Assistant:

static void cptp_sighandler(int signum) {
    switch (signum) {
    case SIGINT:
        log_warn("Received SIGINT");
        break;
    case SIGTERM:
        log_warn("Received SIGTERM");
        break;
    default:
        break;
    }
    if (signum == SIGTERM || signum == SIGINT) {
        if (sighandler_ctx_solver_ptr) {
            sighandler_ctx_solver_ptr->sigterm_occured = true;
            sighandler_ctx_solver_ptr->sigterm_occured_int = 1;
        }
    }
}